

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

MessageProcessingResult __thiscall helics::FederateState::processQueue(FederateState *this)

{
  FederateStates FVar1;
  bool bVar2;
  MessageProcessingResult MVar3;
  bool bVar4;
  mapped_type *pmVar5;
  MessageProcessingResult MVar6;
  byte bVar7;
  key_type local_ec;
  ActionMessage cmd;
  
  MVar6 = HALTED;
  if ((this->state)._M_i != FINISHED) {
    FVar1 = (this->state)._M_i;
    bVar2 = this->mProfilerActive;
    LOCK();
    (this->queueProcessing)._M_base._M_i = true;
    UNLOCK();
    if (bVar2 == true) {
      generateProfilingMessage(this,true);
    }
    MVar3 = processDelayQueue(this);
    bVar7 = 0;
    while (MVar3 < NEXT_STEP) {
      gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
      pop(&cmd,&this->queue);
      bVar4 = messageShouldBeDelayed(this,&cmd);
      if (bVar4) {
        pmVar5 = std::
                 map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                 ::operator[](&this->delayQueues,&cmd.source_id);
        CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar5,
                   &cmd);
      }
      else {
        MVar3 = processActionMessage(this,&cmd);
        if (MVar3 == ERROR_RESULT) {
          bVar7 = bVar7 | cmd.messageAction == cmd_global_error;
          MVar3 = ERROR_RESULT;
        }
        else if (MVar3 == DELAY_MESSAGE) {
          local_ec.gid = cmd.source_id.gid;
          pmVar5 = std::
                   map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                   ::operator[](&this->delayQueues,&local_ec);
          CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)pmVar5,
                     &cmd);
          MVar3 = DELAY_MESSAGE;
        }
      }
      ActionMessage::~ActionMessage(&cmd);
    }
    if (((MVar3 == ERROR_RESULT) &&
        (!(bool)(FVar1 == ERRORED | bVar7 | (this->state)._M_i != ERRORED))) &&
       (this->mParent != (CommonCore *)0x0)) {
      ActionMessage::ActionMessage(&cmd,cmd_local_error);
      if (this->terminate_on_error == true) {
        ActionMessage::setAction(&cmd,cmd_global_error);
      }
      else {
        TimeCoordinator::localError
                  ((this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl);
      }
      cmd.source_id.gid = (this->global_id)._M_i.gid;
      cmd.dest_id.gid = 0;
      cmd.messageID = this->errorCode;
      SmallBuffer::operator=(&cmd.payload,&this->errorString);
      BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&cmd);
      ActionMessage::~ActionMessage(&cmd);
    }
    MVar6 = ERROR_RESULT;
    if (FVar1 != ERRORED) {
      MVar6 = MVar3;
    }
    LOCK();
    (this->queueProcessing)._M_base._M_i = false;
    UNLOCK();
    if (bVar2 != false) {
      generateProfilingMessage(this,false);
    }
  }
  return MVar6;
}

Assistant:

uint64_t FederateState::getQueueSize() const
{
    uint64_t cnt = 0;
    for (const auto& end_point : interfaceInformation.getEndpoints()) {
        cnt += end_point->availableMessages();
    }
    return cnt;
}